

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrained_type.cpp
# Opt level: O2

int * test_verifier::verify<int_const&,test_predicate>(int *value,test_predicate *p)

{
  BinaryExpr<bool,_bool> local_b0;
  SourceLineInfo local_88;
  AssertionHandler catchAssertionHandler;
  StringRef local_30;
  
  local_b0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_b0.super_ITransientExpression.m_isBinaryExpression = true;
  local_b0.super_ITransientExpression.m_result = false;
  local_b0.super_ITransientExpression._10_6_ = 0;
  local_88.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/constrained_type.cpp"
  ;
  local_88.line = 0x12;
  Catch::StringRef::StringRef(&local_30,"p(value) == expected");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b0,&local_88,local_30,Normal);
  local_88.file = (char *)CONCAT71(local_88.file._1_7_,*value != -1);
  Catch::ExprLhs<bool>::operator==(&local_b0,(ExprLhs<bool> *)&local_88,expected);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b0.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b0.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return value;
}

Assistant:

static T&& verify(T&& value, const Predicate& p)
    {
        REQUIRE(p(value) == expected);
        return std::forward<T>(value);
    }